

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::handleReadEvent(Connection *this)

{
  bool bVar1;
  element_type *this_00;
  ssize_t sVar2;
  int *piVar3;
  int in_ECX;
  long *in_FS_OFFSET;
  undefined1 local_50 [8];
  shared_ptr<Liby::Connection> x;
  char *pcStack_38;
  int ret;
  iovec iov [2];
  Buffer *buffer;
  Connection *this_local;
  
  iov[1].iov_len = (size_t)&this->readBuf_;
  pcStack_38 = Buffer::wdata((Buffer *)iov[1].iov_len);
  iov[0].iov_base = (void *)Buffer::availbleSize((Buffer *)iov[1].iov_len);
  iov[0].iov_len = *in_FS_OFFSET - 0x4000;
  iov[1].iov_base = (void *)0x4000;
  this_00 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->socket_);
  sVar2 = Socket::readv(this_00,(int)&stack0xffffffffffffffc8,(iovec *)0x2,in_ECX);
  x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (int)sVar2;
  if (x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ < 1
     ) {
    if ((x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         == 0) || (piVar3 = __errno_location(), *piVar3 != 0xb)) {
      handleErroEvent(this);
    }
  }
  else {
    if (iov[0].iov_base <
        (void *)(long)x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi._4_4_) {
      Buffer::append((Buffer *)iov[1].iov_len,(off_t)iov[0].iov_base);
      Buffer::append((Buffer *)iov[1].iov_len,(char *)(*in_FS_OFFSET + -0x4000),
                     (long)x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi._4_4_ - (long)iov[0].iov_base);
    }
    else {
      Buffer::append((Buffer *)iov[1].iov_len,
                     (long)x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi._4_4_);
    }
    bVar1 = std::function::operator_cast_to_bool((function *)&this->readEventCallback_);
    if (bVar1) {
      std::enable_shared_from_this<Liby::Connection>::shared_from_this
                ((enable_shared_from_this<Liby::Connection> *)local_50);
      std::function<void_(Liby::Connection_&)>::operator()(&this->readEventCallback_,this);
      std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)local_50);
    }
  }
  return;
}

Assistant:

void Connection::handleReadEvent() {
    Buffer &buffer = readBuf_;

    struct iovec iov[2];
    iov[0].iov_base = buffer.wdata();
    iov[0].iov_len = buffer.availbleSize();
    iov[1].iov_base = extraBuffer;
    iov[1].iov_len = sizeof(extraBuffer);

    int ret = socket_->readv(iov, 2);

    if (ret > 0) {
        if (static_cast<decltype(iov[0].iov_len)>(ret) > iov[0].iov_len) {
            buffer.append(iov[0].iov_len);
            buffer.append(extraBuffer, ret - iov[0].iov_len);
        } else {
            buffer.append(ret);
        }
    } else {
        if (ret != 0 && errno == EAGAIN) {
            return;
        } else {
            handleErroEvent();
            return;
        }
    }

    if (readEventCallback_) {
        auto x = shared_from_this();
        readEventCallback_(*this);
    }
}